

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O2

void sylvan_gc_normal_resize_WRAP(WorkerP *w,Task *__dq_head,TD_sylvan_gc_normal_resize *t)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  ulong size;
  ulong uVar4;
  
  uVar4 = nodes->max_size;
  uVar1 = nodes->table_size;
  if (uVar1 < uVar4) {
    sVar2 = llmsset_count_marked_RUN(nodes);
    if (uVar1 < sVar2 * 2) {
      size = uVar1 * 2;
      if (uVar4 <= uVar1 * 2) {
        size = uVar4;
      }
      llmsset_set_size(nodes,size);
      sVar2 = cache_getsize();
      sVar3 = cache_getmaxsize();
      if (sVar2 < sVar3) {
        uVar4 = sVar2 * 2;
        if (sVar3 <= sVar2 * 2) {
          uVar4 = sVar3;
        }
        cache_setsize(uVar4);
        return;
      }
    }
  }
  return;
}

Assistant:

VOID_TASK_IMPL_0(sylvan_gc_normal_resize)
{
    size_t nodes_size = llmsset_get_size(nodes);
    size_t nodes_max = llmsset_get_max_size(nodes);
    if (nodes_size < nodes_max) {
        size_t marked = llmsset_count_marked(nodes);
        if (marked*2 > nodes_size) {
            size_t new_size = next_size(nodes_size);
            if (new_size > nodes_max) new_size = nodes_max;
            llmsset_set_size(nodes, new_size);

            // also increase the operation cache
            size_t cache_size = cache_getsize();
            size_t cache_max = cache_getmaxsize();
            if (cache_size < cache_max) {
                new_size = next_size(cache_size);
                if (new_size > cache_max) new_size = cache_max;
                cache_setsize(new_size);
            }
        }
    }
}